

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Record_Query_R_PDU::operator==(Record_Query_R_PDU *this,Record_Query_R_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if ((((!KVar1) &&
       (KVar1 = Reliability_Header::operator!=
                          (&this->super_Reliability_Header,&Value->super_Reliability_Header), !KVar1
       )) && (this->m_ui32RqId == Value->m_ui32RqId)) &&
     ((((this->super_Reliability_Header).m_ui8ReqRelSrv ==
        (Value->super_Reliability_Header).m_ui8ReqRelSrv &&
       (this->m_ui16EvntTyp == Value->m_ui16EvntTyp)) &&
      ((this->m_ui32Time == Value->m_ui32Time && (this->m_ui32NumRecs == Value->m_ui32NumRecs))))))
  {
    bVar2 = std::operator!=(&this->m_vui32RecID,&Value->m_vui32RecID);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Record_Query_R_PDU::operator == ( const Record_Query_R_PDU & Value ) const
{
    if( Simulation_Management_Header::operator !=( Value ) )             return false;
    if( Reliability_Header::operator           !=( Value ) )             return false;
    if( m_ui32RqId                             != Value.m_ui32RqId )     return false;
    if( m_ui8ReqRelSrv                         != Value.m_ui8ReqRelSrv ) return false;
    if( m_ui16EvntTyp                          != Value.m_ui16EvntTyp )  return false;
    if( m_ui32Time                             != Value.m_ui32Time )     return false;
    if( m_ui32NumRecs                          != Value.m_ui32NumRecs )  return false;
    if( m_vui32RecID                           != Value.m_vui32RecID )   return false;

    return true;
}